

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::emit_entry_point_declarations(CompilerMSL *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  MSLSamplerMipFilter MVar2;
  MSLSamplerBorderColor MVar3;
  uint id;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  reference ppVar8;
  reference ppVar9;
  SPIRVariable **ppSVar10;
  SPIRType *pSVar11;
  SPIRType *pSVar12;
  CompilerError *pCVar13;
  mapped_type *pmVar14;
  uint *puVar15;
  SPIRVariable *pSVar16;
  pair<unsigned_int,_unsigned_int> *ppVar17;
  uint *__last;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  char *in_R9;
  char (*in_stack_fffffffffffff118) [2];
  string local_c58;
  SPIRVariable *local_c38;
  SPIRVariable *var_5;
  uint *puStack_c28;
  uint32_t var_id_3;
  uint *__end1_5;
  uint *__begin1_5;
  SmallVector<unsigned_int,_8UL> *__range1_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc8;
  char *local_ba8;
  char *local_ba0;
  char *desc_addr_space;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70;
  char *local_b50;
  undefined1 local_b48 [8];
  string addr_space_1;
  SPIRType *type_4;
  SPIRVariable *var_4;
  uint32_t alias_id;
  uint32_t var_id_2;
  pair<unsigned_int,_unsigned_int> *var_pair;
  pair<unsigned_int,_unsigned_int> *__end1_4;
  pair<unsigned_int,_unsigned_int> *__begin1_4;
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL> *__range1_4;
  char *local_ad0;
  undefined1 local_ac8 [8];
  string alias_name;
  ID local_aa0;
  uint32_t desc_binding;
  undefined1 local_a98 [4];
  uint32_t desc_set_1;
  string name_2;
  string addr_space;
  SPIRType *type_3;
  SPIRVariable *var_3;
  uint *var_id_1;
  uint *__end1_3;
  uint *__begin1_3;
  SmallVector<unsigned_int,_8UL> *__range1_3;
  uint32_t i_1;
  uint32_t array_size_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  string local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  string local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  uint32_t local_934;
  undefined1 local_930 [8];
  string resource_name;
  string name_1;
  SPIRType *buffer_type;
  SPIRType *type_2;
  SPIRVariable *var_2;
  SPIRVariable *arg;
  SPIRVariable **__end1_2;
  SPIRVariable **__begin1_2;
  SmallVector<spirv_cross::SPIRVariable_*,_8UL> *__range1_2;
  undefined1 local_8b0 [7];
  bool has_runtime_array_declaration;
  allocator local_889;
  string local_888;
  string local_868;
  string local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  char *local_808;
  string local_800;
  char *local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  string local_7b8;
  char *local_798;
  string local_790;
  uint local_76c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  allocator local_741;
  string local_740;
  string local_720;
  string local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  char *local_6c0;
  string local_6b8;
  char *local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  string local_670;
  uint local_650;
  uint32_t local_64c;
  uint32_t i;
  uint32_t array_size;
  char *local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  string local_600;
  uint local_5e0;
  uint32_t local_5dc;
  uint32_t base_index;
  uint32_t arg_id;
  undefined1 local_5d0 [4];
  uint32_t desc_set;
  string name;
  SPIRType *type_1;
  uint32_t var_id;
  SPIRVariable *var_1;
  pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_> *dynamic_buffer;
  iterator __end1_1;
  iterator __begin1_1;
  map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *__range1_1;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  allocator local_491;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  allocator local_469;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  allocator local_441;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  allocator local_419;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  allocator local_3f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  allocator local_3c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  allocator local_3a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  allocator local_379;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  allocator local_351;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  allocator local_329;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  allocator local_301;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  allocator local_259;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  allocator local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  allocator local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  allocator local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  allocator local_1b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  allocator local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  MSLConstexprSampler *local_160;
  MSLConstexprSampler *s;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  args;
  SPIRType *type;
  SPIRVariable *var;
  pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler> *samp;
  iterator __end1;
  iterator __begin1;
  map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
  *__range1;
  CompilerMSL *this_local;
  
  declare_complex_constant_arrays(this);
  __end1 = ::std::
           map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
           ::begin(&this->constexpr_samplers_by_id);
  samp = (pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler> *)
         ::std::
         map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
         ::end(&this->constexpr_samplers_by_id);
  do {
    bVar4 = ::std::operator!=(&__end1,(_Self *)&samp);
    if (!bVar4) {
      __end1_1 = ::std::
                 map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                 ::begin(&this->buffers_requiring_dynamic_offset);
      dynamic_buffer =
           (pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_> *)
           ::std::
           map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
           ::end(&this->buffers_requiring_dynamic_offset);
      do {
        bVar4 = ::std::operator!=(&__end1_1,(_Self *)&dynamic_buffer);
        if (!bVar4) {
          bVar4 = false;
          __end1_2 = VectorView<spirv_cross::SPIRVariable_*>::begin
                               (&(this->entry_point_bindings).
                                 super_VectorView<spirv_cross::SPIRVariable_*>);
          ppSVar10 = VectorView<spirv_cross::SPIRVariable_*>::end
                               (&(this->entry_point_bindings).
                                 super_VectorView<spirv_cross::SPIRVariable_*>);
          do {
            if (__end1_2 == ppSVar10) {
              if (bVar4) {
                CompilerGLSL::statement_no_indent<char_const(&)[1]>
                          (&this->super_CompilerGLSL,(char (*) [1])0x48ca95);
              }
              __end1_3 = VectorView<unsigned_int>::begin
                                   (&(this->buffer_aliases_discrete).super_VectorView<unsigned_int>)
              ;
              puVar15 = VectorView<unsigned_int>::end
                                  (&(this->buffer_aliases_discrete).super_VectorView<unsigned_int>);
              for (; __end1_3 != puVar15; __end1_3 = __end1_3 + 1) {
                pSVar16 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,*__end1_3);
                pSVar11 = Compiler::get_variable_data_type((Compiler *)this,pSVar16);
                get_argument_address_space_abi_cxx11_
                          ((string *)((long)&name_2.field_2 + 8),this,pSVar16);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          (local_a98,this,(ulong)*__end1_3,1);
                TypedID<(spirv_cross::Types)0>::TypedID(&local_aa0,*__end1_3);
                desc_binding = Compiler::get_decoration
                                         ((Compiler *)this,local_aa0,DecorationDescriptorSet);
                TypedID<(spirv_cross::Types)0>::TypedID
                          ((TypedID<(spirv_cross::Types)0> *)((long)&alias_name.field_2 + 8),
                           *__end1_3);
                alias_name.field_2._12_4_ =
                     Compiler::get_decoration
                               ((Compiler *)this,(ID)alias_name.field_2._8_4_,DecorationBinding);
                join<char_const(&)[18],unsigned_int&,char_const(&)[8],unsigned_int&>
                          ((string *)local_ac8,(spirv_cross *)"spvBufferAliasSet",
                           (char (*) [18])&desc_binding,(uint *)"Binding",
                           (char (*) [8])((long)&alias_name.field_2 + 0xc),(uint *)in_R9);
                local_ad0 = to_restrict(this,*__end1_3,true);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&__range1_4,this,pSVar11,0);
                pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&name_2.field_2 + 8);
                in_R9 = " = *(";
                CompilerGLSL::
                statement<std::__cxx11::string&,char_const(&)[8],char_const*,std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                          (&this->super_CompilerGLSL,pbVar1,(char (*) [8])" auto& ",&local_ad0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a98,(char (*) [6])" = *(",pbVar1,(char (*) [2])0x4921b2,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__range1_4,(char (*) [3])0x4ae282,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_ac8,(char (*) [2])0x4af37c);
                ::std::__cxx11::string::~string((string *)&__range1_4);
                ::std::__cxx11::string::~string((string *)local_ac8);
                ::std::__cxx11::string::~string((string *)local_a98);
                ::std::__cxx11::string::~string((string *)(name_2.field_2._M_local_buf + 8));
              }
              SmallVector<unsigned_int,_8UL>::clear(&this->buffer_aliases_discrete);
              __end1_4 = VectorView<std::pair<unsigned_int,_unsigned_int>_>::begin
                                   (&(this->buffer_aliases_argument).
                                     super_VectorView<std::pair<unsigned_int,_unsigned_int>_>);
              ppVar17 = VectorView<std::pair<unsigned_int,_unsigned_int>_>::end
                                  (&(this->buffer_aliases_argument).
                                    super_VectorView<std::pair<unsigned_int,_unsigned_int>_>);
              for (; __end1_4 != ppVar17; __end1_4 = __end1_4 + 1) {
                id = __end1_4->first;
                uVar7 = __end1_4->second;
                pSVar16 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,id);
                addr_space_1.field_2._8_8_ =
                     Compiler::get_variable_data_type((Compiler *)this,pSVar16);
                get_argument_address_space_abi_cxx11_((string *)local_b48,this,pSVar16);
                bVar4 = VectorView<unsigned_int>::empty
                                  ((VectorView<unsigned_int> *)(addr_space_1.field_2._8_8_ + 0x20));
                if (bVar4) {
                  local_b50 = to_restrict(this,id,true);
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            (&local_b70,this,(ulong)id,1);
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (&local_b90,this,addr_space_1.field_2._8_8_,0);
                  TypedID<(spirv_cross::Types)0>::TypedID
                            ((TypedID<(spirv_cross::Types)0> *)((long)&desc_addr_space + 4),uVar7);
                  pmVar14 = ::std::
                            unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                            ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                                         (key_type *)((long)&desc_addr_space + 4));
                  CompilerGLSL::
                  statement<std::__cxx11::string&,char_const(&)[8],char_const*,std::__cxx11::string,char_const(&)[5],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                            (&this->super_CompilerGLSL,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b48,(char (*) [8])" auto& ",&local_b50,&local_b70,
                             (char (*) [5])0x4a16fd,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b48,(char (*) [2])0x4921b2,&local_b90,(char (*) [3])0x4afa54,
                             &(pmVar14->decoration).qualified_alias,(char (*) [2])0x4af37c);
                  ::std::__cxx11::string::~string((string *)&local_b90);
                  ::std::__cxx11::string::~string((string *)&local_b70);
                }
                else {
                  local_ba0 = descriptor_address_space(this,id,pSVar16->storage,"thread");
                  this->is_using_builtin_array = true;
                  local_ba8 = to_restrict(this,id,true);
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            (&local_bc8,this,(ulong)id,1);
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (&local_be8,this,addr_space_1.field_2._8_8_,0);
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
                            (&local_c08,this,addr_space_1.field_2._8_8_,(ulong)id);
                  TypedID<(spirv_cross::Types)0>::TypedID
                            ((TypedID<(spirv_cross::Types)0> *)((long)&__range1_5 + 4),uVar7);
                  pmVar14 = ::std::
                            unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                            ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                                         (key_type *)((long)&__range1_5 + 4));
                  CompilerGLSL::
                  statement<char_const*&,char_const(&)[8],char_const*,std::__cxx11::string,char_const(&)[5],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*&,char_const(&)[5],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                            (&this->super_CompilerGLSL,&local_ba0,(char (*) [8])" auto& ",&local_ba8
                             ,&local_bc8,(char (*) [5])0x4a16fd,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b48,(char (*) [2])0x4921b2,&local_be8,(char (*) [3])0x4a07e1,
                             &local_ba0,(char (*) [5])" (&)",&local_c08,(char (*) [2])0x4b01ae,
                             &(pmVar14->decoration).qualified_alias,(char (*) [2])0x4af37c);
                  ::std::__cxx11::string::~string((string *)&local_c08);
                  ::std::__cxx11::string::~string((string *)&local_be8);
                  ::std::__cxx11::string::~string((string *)&local_bc8);
                  this->is_using_builtin_array = false;
                }
                ::std::__cxx11::string::~string((string *)local_b48);
              }
              puVar15 = VectorView<unsigned_int>::begin
                                  (&(this->disabled_frag_outputs).super_VectorView<unsigned_int>);
              __last = VectorView<unsigned_int>::end
                                 (&(this->disabled_frag_outputs).super_VectorView<unsigned_int>);
              ::std::sort<unsigned_int*>(puVar15,__last);
              __begin1_5 = (uint *)&this->disabled_frag_outputs;
              __end1_5 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin1_5);
              puStack_c28 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin1_5);
              for (; __end1_5 != puStack_c28; __end1_5 = __end1_5 + 1) {
                var_5._4_4_ = *__end1_5;
                local_c38 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,var_5._4_4_);
                CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,var_5._4_4_);
                CompilerGLSL::variable_decl_abi_cxx11_
                          (&local_c58,&this->super_CompilerGLSL,local_c38);
                CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
                          (&this->super_CompilerGLSL,&local_c58,(char (*) [2])0x4af37c);
                ::std::__cxx11::string::~string((string *)&local_c58);
                local_c38->deferred_declaration = false;
              }
              return;
            }
            pSVar16 = *__end1_2;
            pSVar11 = Compiler::get_variable_data_type((Compiler *)this,pSVar16);
            pSVar12 = Compiler::get_variable_element_type((Compiler *)this,pSVar16);
            uVar7 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar16->super_IVariant).self);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      ((undefined1 *)((long)&resource_name.field_2 + 8),this,(ulong)uVar7,1);
            bVar5 = is_var_runtime_size_array(this,pSVar16);
            if (bVar5) {
              if ((int)(this->msl_options).argument_buffers_tier < 1) {
                pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError
                          (pCVar13,"Unsized array of descriptors requires argument buffer tier 2");
                __cxa_throw(pCVar13,&CompilerError::typeinfo,CompilerError::~CompilerError);
              }
              ::std::__cxx11::string::string((string *)local_930);
              local_934 = (pSVar16->super_IVariant).self.id;
              uVar7 = Compiler::get_decoration
                                ((Compiler *)this,(ID)local_934,DecorationDescriptorSet);
              bVar4 = descriptor_set_is_argument_buffer(this,uVar7);
              if (bVar4) {
                pmVar14 = ::std::
                          unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                          ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                                       &(pSVar16->super_IVariant).self);
                ::std::__cxx11::string::operator=
                          ((string *)local_930,(string *)&(pmVar14->decoration).qualified_alias);
              }
              else {
                ::std::operator+(&local_958,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&resource_name.field_2 + 8),"_");
                ::std::__cxx11::string::operator=((string *)local_930,(string *)&local_958);
                ::std::__cxx11::string::~string((string *)&local_958);
              }
              switch(pSVar11->basetype) {
              case Struct:
                get_argument_address_space_abi_cxx11_(&local_9b8,this,pSVar16);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&local_9d8,this,pSVar12,0);
                in_R9 = "*> ";
                CompilerGLSL::
                statement<char_const(&)[20],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                          (&this->super_CompilerGLSL,(char (*) [20])"spvDescriptorArray<",&local_9b8
                           ,(char (*) [2])0x4921b2,&local_9d8,(char (*) [4])"*> ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&resource_name.field_2 + 8),(char (*) [3])0x491a1c,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_930,(char (*) [3])0x498c90);
                ::std::__cxx11::string::~string((string *)&local_9d8);
                ::std::__cxx11::string::~string((string *)&local_9b8);
                break;
              case Image:
              case Sampler:
              case AccelerationStructure:
                uVar7 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(pSVar16->super_IVariant).self);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&local_978,this,pSVar12,(ulong)uVar7);
                in_R9 = " {";
                CompilerGLSL::
                statement<char_const(&)[20],std::__cxx11::string,char_const(&)[3],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                          (&this->super_CompilerGLSL,(char (*) [20])"spvDescriptorArray<",&local_978
                           ,(char (*) [3])0x4af333,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&resource_name.field_2 + 8),(char (*) [3])0x491a1c,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_930,(char (*) [3])0x498c90);
                ::std::__cxx11::string::~string((string *)&local_978);
                break;
              case SampledImage:
                uVar7 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(pSVar16->super_IVariant).self);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&local_998,this,pSVar12,(ulong)uVar7);
                CompilerGLSL::
                statement<char_const(&)[20],std::__cxx11::string,char_const(&)[3],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                          (&this->super_CompilerGLSL,(char (*) [20])"spvDescriptorArray<",&local_998
                           ,(char (*) [3])0x4af333,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&resource_name.field_2 + 8),(char (*) [3])0x491a1c,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_930,(char (*) [3])0x498c90);
                ::std::__cxx11::string::~string((string *)&local_998);
                in_R9 = "Smplr_};";
                pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&resource_name.field_2 + 8);
                CompilerGLSL::
                statement<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[8],std::__cxx11::string_const&,char_const(&)[9]>
                          (&this->super_CompilerGLSL,(char (*) [29])"spvDescriptorArray<sampler> ",
                           pbVar1,(char (*) [8])"Smplr {",pbVar1,(char (*) [9])"Smplr_};");
              }
              bVar4 = true;
              ::std::__cxx11::string::~string((string *)local_930);
            }
            else {
              bVar5 = VectorView<unsigned_int>::empty
                                (&(pSVar11->array).super_VectorView<unsigned_int>);
              if ((!bVar5) && (pSVar11->basetype == Struct)) {
                get_argument_address_space_abi_cxx11_(&local_9f8,this,pSVar16);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&local_a18,this,pSVar12,0);
                uVar7 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(pSVar16->super_IVariant).self);
                _i_1 = to_restrict(this,uVar7,true);
                in_R9 = (char *)&i_1;
                CompilerGLSL::
                statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,std::__cxx11::string_const&,char_const(&)[5]>
                          (&this->super_CompilerGLSL,&local_9f8,(char (*) [2])0x4921b2,&local_a18,
                           (char (*) [3])0x4a07e1,(char **)in_R9,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&resource_name.field_2 + 8),(char (*) [5])"[] =");
                ::std::__cxx11::string::~string((string *)&local_a18);
                ::std::__cxx11::string::~string((string *)&local_9f8);
                CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
                uVar7 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(pSVar16->super_IVariant).self);
                __range1_3._4_4_ = get_resource_array_size(this,pSVar11,uVar7);
                for (__range1_3._0_4_ = 0; (uint)__range1_3 < __range1_3._4_4_;
                    __range1_3._0_4_ = (uint)__range1_3 + 1) {
                  CompilerGLSL::
                  statement<std::__cxx11::string_const&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                            (&this->super_CompilerGLSL,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&resource_name.field_2 + 8),(char (*) [2])0x490ae3,
                             (uint *)&__range1_3,(char (*) [2])0x4965f8);
                }
                CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
                CompilerGLSL::statement_no_indent<char_const(&)[1]>
                          (&this->super_CompilerGLSL,(char (*) [1])0x48ca95);
              }
            }
            ::std::__cxx11::string::~string((string *)(resource_name.field_2._M_local_buf + 8));
            __end1_2 = __end1_2 + 1;
          } while( true );
        }
        ppVar9 = ::std::
                 _Rb_tree_iterator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>
                 ::operator*(&__end1_1);
        if ((ppVar9->second).second != 0) {
          pSVar16 = Compiler::get<spirv_cross::SPIRVariable>
                              ((Compiler *)this,(ppVar9->second).second);
          uVar7 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar16->super_IVariant).self)
          ;
          name.field_2._8_8_ = Compiler::get_variable_data_type((Compiler *)this,pSVar16);
          uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar16->super_IVariant).self)
          ;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_5d0,this,(ulong)uVar6,1);
          base_index = (pSVar16->super_IVariant).self.id;
          arg_id = Compiler::get_decoration((Compiler *)this,(ID)base_index,DecorationDescriptorSet)
          ;
          local_5dc = this->argument_buffer_ids[arg_id];
          local_5e0 = (ppVar9->second).first;
          bVar4 = Compiler::is_array((Compiler *)this,(SPIRType *)name.field_2._8_8_);
          if (bVar4) {
            this->is_using_builtin_array = true;
            get_argument_address_space_abi_cxx11_(&local_600,this,pSVar16);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_620,this,name.field_2._8_8_,0);
            local_628 = to_restrict(this,uVar7,true);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
                      (&i,this,name.field_2._8_8_,(ulong)uVar7);
            in_R9 = (char *)&local_628;
            CompilerGLSL::
            statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,std::__cxx11::string&,std::__cxx11::string,char_const(&)[3]>
                      (&this->super_CompilerGLSL,&local_600,(char (*) [2])0x4921b2,&local_620,
                       (char (*) [3])0x4a07e1,(char **)in_R9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                       (char (*) [3])0x49668d);
            ::std::__cxx11::string::~string((string *)&i);
            ::std::__cxx11::string::~string((string *)&local_620);
            ::std::__cxx11::string::~string((string *)&local_600);
            local_64c = get_resource_array_size(this,(SPIRType *)name.field_2._8_8_,uVar7);
            if (local_64c == 0) {
              pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (pCVar13,
                         "Size of runtime array with dynamic offset could not be determined from resource bindings."
                        );
              __cxa_throw(pCVar13,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
            for (local_650 = 0; local_650 < local_64c; local_650 = local_650 + 1) {
              get_argument_address_space_abi_cxx11_(&local_670,this,pSVar16);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&local_690,this,name.field_2._8_8_,0);
              local_698 = to_restrict(this,uVar7,false);
              get_argument_address_space_abi_cxx11_(&local_6b8,this,pSVar16);
              local_6c0 = to_restrict(this,uVar7,false);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&local_6e0,this,(ulong)local_5dc,1);
              ::std::__cxx11::string::string((string *)&local_720,(string *)local_5d0);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)&local_740,"m",&local_741);
              ensure_valid_name(&local_700,this,&local_720,&local_740);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&local_768,this,(ulong)this->dynamic_offsets_buffer_id,1);
              local_76c = local_5e0 + local_650;
              in_R9 = "* ";
              CompilerGLSL::
              statement<char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[8],char_const*,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int,char_const(&)[4]>
                        (&this->super_CompilerGLSL,(char (*) [2])0x4a488c,&local_670,
                         (char (*) [2])0x4921b2,&local_690,(char (*) [3])0x4a07e1,&local_698,
                         (char (*) [4])")((",&local_6b8,(char (*) [8])" char* ",&local_6c0,
                         (char (*) [2])0x4b01ae,&local_6e0,(char (*) [2])0x4aff3f,&local_700,
                         (char (*) [2])0x48521e,&local_650,(char (*) [2])0x490482,
                         (char (*) [4])0x498466,&local_768,(char (*) [2])0x48521e,&local_76c,
                         (char (*) [4])"]),");
              ::std::__cxx11::string::~string((string *)&local_768);
              ::std::__cxx11::string::~string((string *)&local_700);
              ::std::__cxx11::string::~string((string *)&local_740);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_741);
              ::std::__cxx11::string::~string((string *)&local_720);
              ::std::__cxx11::string::~string((string *)&local_6e0);
              ::std::__cxx11::string::~string((string *)&local_6b8);
              ::std::__cxx11::string::~string((string *)&local_690);
              ::std::__cxx11::string::~string((string *)&local_670);
            }
            CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
            CompilerGLSL::statement_no_indent<char_const(&)[1]>
                      (&this->super_CompilerGLSL,(char (*) [1])0x48ca95);
            this->is_using_builtin_array = false;
          }
          else {
            get_argument_address_space_abi_cxx11_(&local_790,this,pSVar16);
            local_798 = to_restrict(this,uVar7,true);
            get_argument_address_space_abi_cxx11_(&local_7b8,this,pSVar16);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_7d8,this,name.field_2._8_8_,0);
            local_7e0 = to_restrict(this,uVar7,false);
            get_argument_address_space_abi_cxx11_(&local_800,this,pSVar16);
            local_808 = to_restrict(this,uVar7,false);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&local_828,this,(ulong)local_5dc,1);
            ::std::__cxx11::string::string((string *)&local_868,(string *)local_5d0);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_888,"m",&local_889);
            ensure_valid_name(&local_848,this,&local_868,&local_888);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (local_8b0,this,(ulong)this->dynamic_offsets_buffer_id,1);
            in_R9 = " = *(";
            CompilerGLSL::
            statement<std::__cxx11::string,char_const(&)[8],char_const*,std::__cxx11::string&,char_const(&)[6],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[8],char_const*,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[4]>
                      (&this->super_CompilerGLSL,&local_790,(char (*) [8])" auto& ",&local_798,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5d0,(char (*) [6])" = *(",&local_7b8,(char (*) [2])0x4921b2,&local_7d8,
                       (char (*) [3])0x4a07e1,&local_7e0,(char (*) [4])")((",&local_800,
                       (char (*) [8])" char* ",&local_808,(char (*) [2])0x4b01ae,&local_828,
                       (char (*) [2])0x4aff3f,&local_848,(char (*) [4])0x498466,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8b0,(char (*) [2])0x48521e,&local_5e0,(char (*) [4])0x48f0f7);
            ::std::__cxx11::string::~string((string *)local_8b0);
            ::std::__cxx11::string::~string((string *)&local_848);
            ::std::__cxx11::string::~string((string *)&local_888);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_889);
            ::std::__cxx11::string::~string((string *)&local_868);
            ::std::__cxx11::string::~string((string *)&local_828);
            ::std::__cxx11::string::~string((string *)&local_800);
            ::std::__cxx11::string::~string((string *)&local_7d8);
            ::std::__cxx11::string::~string((string *)&local_7b8);
            ::std::__cxx11::string::~string((string *)&local_790);
          }
          ::std::__cxx11::string::~string((string *)local_5d0);
        }
        ::std::
        _Rb_tree_iterator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>
        ::operator++(&__end1_1);
      } while( true );
    }
    ppVar8 = ::std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>::
             operator*(&__end1);
    pSVar16 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,ppVar8->first);
    uVar7 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar16->super_IVariant).field_0xc);
    args.stack_storage.aligned_char._248_8_ =
         Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar7);
    if (((SPIRType *)args.stack_storage.aligned_char._248_8_)->basetype == Sampler) {
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,ppVar8->first);
    }
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)&s);
    local_160 = &ppVar8->second;
    if (local_160->coord != MSL_SAMPLER_COORD_NORMALIZED) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_180,"coord::pixel",&local_181);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)&s,&local_180);
      ::std::__cxx11::string::~string((string *)&local_180);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
    }
    if (local_160->min_filter == local_160->mag_filter) {
      if (local_160->min_filter != MSL_SAMPLER_FILTER_NEAREST) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_1b8,"filter::linear",&local_1b9);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_1b8);
        ::std::__cxx11::string::~string((string *)&local_1b8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      }
    }
    else {
      if (local_160->min_filter != MSL_SAMPLER_FILTER_NEAREST) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_1e0,"min_filter::linear",&local_1e1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_1e0);
        ::std::__cxx11::string::~string((string *)&local_1e0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      }
      if (local_160->mag_filter != MSL_SAMPLER_FILTER_NEAREST) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_208,"mag_filter::linear",&local_209);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_208);
        ::std::__cxx11::string::~string((string *)&local_208);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_209);
      }
    }
    MVar2 = local_160->mip_filter;
    if (MVar2 != MSL_SAMPLER_MIP_FILTER_NONE) {
      if (MVar2 == MSL_SAMPLER_MIP_FILTER_NEAREST) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_230,"mip_filter::nearest",&local_231);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_230);
        ::std::__cxx11::string::~string((string *)&local_230);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
      }
      else {
        if (MVar2 != MSL_SAMPLER_MIP_FILTER_LINEAR) {
          pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar13,"Invalid mip filter.");
          __cxa_throw(pCVar13,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_258,"mip_filter::linear",&local_259);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_258);
        ::std::__cxx11::string::~string((string *)&local_258);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_259);
      }
    }
    if ((local_160->s_address == local_160->t_address) &&
       (local_160->s_address == local_160->r_address)) {
      if (local_160->s_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
        create_sampler_address_abi_cxx11_(&local_280,"",local_160->s_address);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_280);
        ::std::__cxx11::string::~string((string *)&local_280);
      }
    }
    else {
      if (local_160->s_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
        create_sampler_address_abi_cxx11_(&local_2a0,"s_",local_160->s_address);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_2a0);
        ::std::__cxx11::string::~string((string *)&local_2a0);
      }
      if (local_160->t_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
        create_sampler_address_abi_cxx11_(&local_2c0,"t_",local_160->t_address);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_2c0);
        ::std::__cxx11::string::~string((string *)&local_2c0);
      }
      if (local_160->r_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
        create_sampler_address_abi_cxx11_(&local_2e0,"r_",local_160->r_address);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_2e0);
        ::std::__cxx11::string::~string((string *)&local_2e0);
      }
    }
    if ((local_160->compare_enable & 1U) != 0) {
      switch(local_160->compare_func) {
      case MSL_SAMPLER_COMPARE_FUNC_NEVER:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_328,"compare_func::never",&local_329);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_328);
        ::std::__cxx11::string::~string((string *)&local_328);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_329);
        break;
      case MSL_SAMPLER_COMPARE_FUNC_LESS:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_3a0,"compare_func::less",&local_3a1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_3a0);
        ::std::__cxx11::string::~string((string *)&local_3a0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
        break;
      case MSL_SAMPLER_COMPARE_FUNC_LESS_EQUAL:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_3c8,"compare_func::less_equal",&local_3c9);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_3c8);
        ::std::__cxx11::string::~string((string *)&local_3c8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
        break;
      case MSL_SAMPLER_COMPARE_FUNC_GREATER:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_3f0,"compare_func::greater",&local_3f1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_3f0);
        ::std::__cxx11::string::~string((string *)&local_3f0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
        break;
      case MSL_SAMPLER_COMPARE_FUNC_GREATER_EQUAL:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_418,"compare_func::greater_equal",&local_419);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_418);
        ::std::__cxx11::string::~string((string *)&local_418);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_419);
        break;
      case MSL_SAMPLER_COMPARE_FUNC_EQUAL:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_350,"compare_func::equal",&local_351);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_350);
        ::std::__cxx11::string::~string((string *)&local_350);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_351);
        break;
      case MSL_SAMPLER_COMPARE_FUNC_NOT_EQUAL:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_378,"compare_func::not_equal",&local_379);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_378);
        ::std::__cxx11::string::~string((string *)&local_378);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_379);
        break;
      case MSL_SAMPLER_COMPARE_FUNC_ALWAYS:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_300,"compare_func::always",&local_301);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_300);
        ::std::__cxx11::string::~string((string *)&local_300);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_301);
        break;
      default:
        pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar13,"Invalid sampler compare function.");
        __cxa_throw(pCVar13,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    }
    if (((local_160->s_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER) ||
        (local_160->t_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER)) ||
       (local_160->r_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER)) {
      MVar3 = local_160->border_color;
      if (MVar3 == MSL_SAMPLER_BORDER_COLOR_TRANSPARENT_BLACK) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_490,"border_color::transparent_black",&local_491);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_490);
        ::std::__cxx11::string::~string((string *)&local_490);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_491);
      }
      else if (MVar3 == MSL_SAMPLER_BORDER_COLOR_OPAQUE_BLACK) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_440,"border_color::opaque_black",&local_441)
        ;
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_440);
        ::std::__cxx11::string::~string((string *)&local_440);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_441);
      }
      else {
        if (MVar3 != MSL_SAMPLER_BORDER_COLOR_OPAQUE_WHITE) {
          pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar13,"Invalid sampler border color.");
          __cxa_throw(pCVar13,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_468,"border_color::opaque_white",&local_469)
        ;
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,&local_468);
        ::std::__cxx11::string::~string((string *)&local_468);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_469);
      }
    }
    if ((local_160->anisotropy_enable & 1U) != 0) {
      join<char_const(&)[16],int&,char_const(&)[2]>
                (&local_4b8,(spirv_cross *)"max_anisotropy(",
                 (char (*) [16])&local_160->max_anisotropy,(int *)0x4b01ae,(char (*) [2])in_R8);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)&s,&local_4b8);
      ::std::__cxx11::string::~string((string *)&local_4b8);
    }
    if ((local_160->lod_clamp_enable & 1U) != 0) {
      CompilerGLSL::format_float_abi_cxx11_
                (&local_4f8,&this->super_CompilerGLSL,local_160->lod_clamp_min);
      CompilerGLSL::format_float_abi_cxx11_
                (&local_518,&this->super_CompilerGLSL,local_160->lod_clamp_max);
      in_R9 = ")";
      in_R8 = &local_518;
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
                (&local_4d8,(spirv_cross *)0x4a136f,(char (*) [11])&local_4f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
                 (char (*) [3])in_R8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
                 in_stack_fffffffffffff118);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)&s,&local_4d8);
      ::std::__cxx11::string::~string((string *)&local_4d8);
      ::std::__cxx11::string::~string((string *)&local_518);
      ::std::__cxx11::string::~string((string *)&local_4f8);
    }
    bVar4 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::empty((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&s);
    if (bVar4) {
      if (*(int *)(args.stack_storage.aligned_char._248_8_ + 0x10) == 0x11) {
        to_sampler_expression_abi_cxx11_(&local_538,this,ppVar8->first);
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_538,this,(ulong)ppVar8->first,1);
      }
      CompilerGLSL::statement<char_const(&)[19],std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [19])"constexpr sampler ",&local_538,
                 (char (*) [2])0x4af37c);
      ::std::__cxx11::string::~string((string *)&local_538);
    }
    else {
      if (*(int *)(args.stack_storage.aligned_char._248_8_ + 0x10) == 0x11) {
        to_sampler_expression_abi_cxx11_(&local_558,this,ppVar8->first);
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_558,this,(ulong)ppVar8->first,1);
      }
      merge((string *)&__range1_1,
            (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
             *)&s,", ");
      in_R9 = ");";
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1;
      CompilerGLSL::
      statement<char_const(&)[19],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,(char (*) [19])"constexpr sampler ",&local_558,
                 (char (*) [2])0x4a488c,in_R8,(char (*) [3])0x4af37b);
      ::std::__cxx11::string::~string((string *)&__range1_1);
      ::std::__cxx11::string::~string((string *)&local_558);
    }
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                    *)&s);
    ::std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

void CompilerMSL::emit_entry_point_declarations()
{
	// FIXME: Get test coverage here ...
	// Constant arrays of non-primitive types (i.e. matrices) won't link properly into Metal libraries
	declare_complex_constant_arrays();

	// Emit constexpr samplers here.
	for (auto &samp : constexpr_samplers_by_id)
	{
		auto &var = get<SPIRVariable>(samp.first);
		auto &type = get<SPIRType>(var.basetype);
		if (type.basetype == SPIRType::Sampler)
			add_resource_name(samp.first);

		SmallVector<string> args;
		auto &s = samp.second;

		if (s.coord != MSL_SAMPLER_COORD_NORMALIZED)
			args.push_back("coord::pixel");

		if (s.min_filter == s.mag_filter)
		{
			if (s.min_filter != MSL_SAMPLER_FILTER_NEAREST)
				args.push_back("filter::linear");
		}
		else
		{
			if (s.min_filter != MSL_SAMPLER_FILTER_NEAREST)
				args.push_back("min_filter::linear");
			if (s.mag_filter != MSL_SAMPLER_FILTER_NEAREST)
				args.push_back("mag_filter::linear");
		}

		switch (s.mip_filter)
		{
		case MSL_SAMPLER_MIP_FILTER_NONE:
			// Default
			break;
		case MSL_SAMPLER_MIP_FILTER_NEAREST:
			args.push_back("mip_filter::nearest");
			break;
		case MSL_SAMPLER_MIP_FILTER_LINEAR:
			args.push_back("mip_filter::linear");
			break;
		default:
			SPIRV_CROSS_THROW("Invalid mip filter.");
		}

		if (s.s_address == s.t_address && s.s_address == s.r_address)
		{
			if (s.s_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("", s.s_address));
		}
		else
		{
			if (s.s_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("s_", s.s_address));
			if (s.t_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("t_", s.t_address));
			if (s.r_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("r_", s.r_address));
		}

		if (s.compare_enable)
		{
			switch (s.compare_func)
			{
			case MSL_SAMPLER_COMPARE_FUNC_ALWAYS:
				args.push_back("compare_func::always");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_NEVER:
				args.push_back("compare_func::never");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_EQUAL:
				args.push_back("compare_func::equal");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_NOT_EQUAL:
				args.push_back("compare_func::not_equal");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_LESS:
				args.push_back("compare_func::less");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_LESS_EQUAL:
				args.push_back("compare_func::less_equal");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_GREATER:
				args.push_back("compare_func::greater");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_GREATER_EQUAL:
				args.push_back("compare_func::greater_equal");
				break;
			default:
				SPIRV_CROSS_THROW("Invalid sampler compare function.");
			}
		}

		if (s.s_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER || s.t_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER ||
		    s.r_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER)
		{
			switch (s.border_color)
			{
			case MSL_SAMPLER_BORDER_COLOR_OPAQUE_BLACK:
				args.push_back("border_color::opaque_black");
				break;
			case MSL_SAMPLER_BORDER_COLOR_OPAQUE_WHITE:
				args.push_back("border_color::opaque_white");
				break;
			case MSL_SAMPLER_BORDER_COLOR_TRANSPARENT_BLACK:
				args.push_back("border_color::transparent_black");
				break;
			default:
				SPIRV_CROSS_THROW("Invalid sampler border color.");
			}
		}

		if (s.anisotropy_enable)
			args.push_back(join("max_anisotropy(", s.max_anisotropy, ")"));
		if (s.lod_clamp_enable)
		{
			args.push_back(join("lod_clamp(", format_float(s.lod_clamp_min), ", ", format_float(s.lod_clamp_max), ")"));
		}

		// If we would emit no arguments, then omit the parentheses entirely. Otherwise,
		// we'll wind up with a "most vexing parse" situation.
		if (args.empty())
			statement("constexpr sampler ",
			          type.basetype == SPIRType::SampledImage ? to_sampler_expression(samp.first) : to_name(samp.first),
			          ";");
		else
			statement("constexpr sampler ",
			          type.basetype == SPIRType::SampledImage ? to_sampler_expression(samp.first) : to_name(samp.first),
			          "(", merge(args), ");");
	}

	// Emit dynamic buffers here.
	for (auto &dynamic_buffer : buffers_requiring_dynamic_offset)
	{
		if (!dynamic_buffer.second.second)
		{
			// Could happen if no buffer was used at requested binding point.
			continue;
		}

		const auto &var = get<SPIRVariable>(dynamic_buffer.second.second);
		uint32_t var_id = var.self;
		const auto &type = get_variable_data_type(var);
		string name = to_name(var.self);
		uint32_t desc_set = get_decoration(var.self, DecorationDescriptorSet);
		uint32_t arg_id = argument_buffer_ids[desc_set];
		uint32_t base_index = dynamic_buffer.second.first;

		if (is_array(type))
		{
			is_using_builtin_array = true;
			statement(get_argument_address_space(var), " ", type_to_glsl(type), "* ", to_restrict(var_id, true), name,
			          type_to_array_glsl(type, var_id), " =");

			uint32_t array_size = get_resource_array_size(type, var_id);
			if (array_size == 0)
				SPIRV_CROSS_THROW("Size of runtime array with dynamic offset could not be determined from resource bindings.");

			begin_scope();

			for (uint32_t i = 0; i < array_size; i++)
			{
				statement("(", get_argument_address_space(var), " ", type_to_glsl(type), "* ",
				          to_restrict(var_id, false), ")((", get_argument_address_space(var), " char* ",
				          to_restrict(var_id, false), ")", to_name(arg_id), ".", ensure_valid_name(name, "m"),
				          "[", i, "]", " + ", to_name(dynamic_offsets_buffer_id), "[", base_index + i, "]),");
			}

			end_scope_decl();
			statement_no_indent("");
			is_using_builtin_array = false;
		}
		else
		{
			statement(get_argument_address_space(var), " auto& ", to_restrict(var_id, true), name, " = *(",
			          get_argument_address_space(var), " ", type_to_glsl(type), "* ", to_restrict(var_id, false), ")((",
			          get_argument_address_space(var), " char* ", to_restrict(var_id, false), ")", to_name(arg_id), ".",
			          ensure_valid_name(name, "m"), " + ", to_name(dynamic_offsets_buffer_id), "[", base_index, "]);");
		}
	}

	bool has_runtime_array_declaration = false;
	for (SPIRVariable *arg : entry_point_bindings)
	{
		const auto &var = *arg;
		const auto &type = get_variable_data_type(var);
		const auto &buffer_type = get_variable_element_type(var);
		const string name = to_name(var.self);

		if (is_var_runtime_size_array(var))
		{
			if (msl_options.argument_buffers_tier < Options::ArgumentBuffersTier::Tier2)
			{
				SPIRV_CROSS_THROW("Unsized array of descriptors requires argument buffer tier 2");
			}

			string resource_name;
			if (descriptor_set_is_argument_buffer(get_decoration(var.self, DecorationDescriptorSet)))
				resource_name = ir.meta[var.self].decoration.qualified_alias;
			else
				resource_name = name + "_";

			switch (type.basetype)
			{
			case SPIRType::Image:
			case SPIRType::Sampler:
			case SPIRType::AccelerationStructure:
				statement("spvDescriptorArray<", type_to_glsl(buffer_type, var.self), "> ", name, " {", resource_name, "};");
				break;
			case SPIRType::SampledImage:
				statement("spvDescriptorArray<", type_to_glsl(buffer_type, var.self), "> ", name, " {", resource_name, "};");
				// Unsupported with argument buffer for now.
				statement("spvDescriptorArray<sampler> ", name, "Smplr {", name, "Smplr_};");
				break;
			case SPIRType::Struct:
				statement("spvDescriptorArray<", get_argument_address_space(var), " ", type_to_glsl(buffer_type), "*> ",
				          name, " {", resource_name, "};");
				break;
			default:
				break;
			}
			has_runtime_array_declaration = true;
		}
		else if (!type.array.empty() && type.basetype == SPIRType::Struct)
		{
			// Emit only buffer arrays here.
			statement(get_argument_address_space(var), " ", type_to_glsl(buffer_type), "* ",
			          to_restrict(var.self, true), name, "[] =");
			begin_scope();
			uint32_t array_size = get_resource_array_size(type, var.self);
			for (uint32_t i = 0; i < array_size; ++i)
				statement(name, "_", i, ",");
			end_scope_decl();
			statement_no_indent("");
		}
	}

	if (has_runtime_array_declaration)
		statement_no_indent("");

	// Emit buffer aliases here.
	for (auto &var_id : buffer_aliases_discrete)
	{
		const auto &var = get<SPIRVariable>(var_id);
		const auto &type = get_variable_data_type(var);
		auto addr_space = get_argument_address_space(var);
		auto name = to_name(var_id);

		uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
		uint32_t desc_binding = get_decoration(var_id, DecorationBinding);
		auto alias_name = join("spvBufferAliasSet", desc_set, "Binding", desc_binding);

		statement(addr_space, " auto& ", to_restrict(var_id, true),
		          name,
		          " = *(", addr_space, " ", type_to_glsl(type), "*)", alias_name, ";");
	}
	// Discrete descriptors are processed in entry point emission every compiler iteration.
	buffer_aliases_discrete.clear();

	for (auto &var_pair : buffer_aliases_argument)
	{
		uint32_t var_id = var_pair.first;
		uint32_t alias_id = var_pair.second;

		const auto &var = get<SPIRVariable>(var_id);
		const auto &type = get_variable_data_type(var);
		auto addr_space = get_argument_address_space(var);

		if (type.array.empty())
		{
			statement(addr_space, " auto& ", to_restrict(var_id, true), to_name(var_id), " = (", addr_space, " ",
			          type_to_glsl(type), "&)", ir.meta[alias_id].decoration.qualified_alias, ";");
		}
		else
		{
			const char *desc_addr_space = descriptor_address_space(var_id, var.storage, "thread");

			// Esoteric type cast. Reference to array of pointers.
			// Auto here defers to UBO or SSBO. The address space of the reference needs to refer to the
			// address space of the argument buffer itself, which is usually constant, but can be const device for
			// large argument buffers.
			is_using_builtin_array = true;
			statement(desc_addr_space, " auto& ", to_restrict(var_id, true), to_name(var_id), " = (", addr_space, " ",
			          type_to_glsl(type), "* ", desc_addr_space, " (&)",
			          type_to_array_glsl(type, var_id), ")", ir.meta[alias_id].decoration.qualified_alias, ";");
			is_using_builtin_array = false;
		}
	}

	// Emit disabled fragment outputs.
	std::sort(disabled_frag_outputs.begin(), disabled_frag_outputs.end());
	for (uint32_t var_id : disabled_frag_outputs)
	{
		auto &var = get<SPIRVariable>(var_id);
		add_local_variable_name(var_id);
		statement(CompilerGLSL::variable_decl(var), ";");
		var.deferred_declaration = false;
	}
}